

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int resizeIndexObject(sqlite3 *db,Index *pIdx,int N)

{
  char **ppcVar1;
  u8 *__dest;
  int nByte;
  char *zExtra;
  int N_local;
  Index *pIdx_local;
  sqlite3 *db_local;
  
  if ((int)(uint)pIdx->nColumn < N) {
    ppcVar1 = (char **)sqlite3DbMallocZero(db,(long)(N * 0xb));
    if (ppcVar1 == (char **)0x0) {
      db_local._4_4_ = 7;
    }
    else {
      memcpy(ppcVar1,pIdx->azColl,(ulong)pIdx->nColumn << 3);
      pIdx->azColl = ppcVar1;
      ppcVar1 = ppcVar1 + N;
      memcpy(ppcVar1,pIdx->aiColumn,(ulong)pIdx->nColumn << 1);
      pIdx->aiColumn = (i16 *)ppcVar1;
      __dest = (u8 *)((long)N * 2 + (long)ppcVar1);
      memcpy(__dest,pIdx->aSortOrder,(ulong)pIdx->nColumn);
      pIdx->aSortOrder = __dest;
      pIdx->nColumn = (u16)N;
      pIdx->field_0x63 = pIdx->field_0x63 & 0xef | 0x10;
      db_local._4_4_ = 0;
    }
  }
  else {
    db_local._4_4_ = 0;
  }
  return db_local._4_4_;
}

Assistant:

static int resizeIndexObject(sqlite3 *db, Index *pIdx, int N){
  char *zExtra;
  int nByte;
  if( pIdx->nColumn>=N ) return SQLITE_OK;
  assert( pIdx->isResized==0 );
  nByte = (sizeof(char*) + sizeof(i16) + 1)*N;
  zExtra = sqlite3DbMallocZero(db, nByte);
  if( zExtra==0 ) return SQLITE_NOMEM_BKPT;
  memcpy(zExtra, pIdx->azColl, sizeof(char*)*pIdx->nColumn);
  pIdx->azColl = (const char**)zExtra;
  zExtra += sizeof(char*)*N;
  memcpy(zExtra, pIdx->aiColumn, sizeof(i16)*pIdx->nColumn);
  pIdx->aiColumn = (i16*)zExtra;
  zExtra += sizeof(i16)*N;
  memcpy(zExtra, pIdx->aSortOrder, pIdx->nColumn);
  pIdx->aSortOrder = (u8*)zExtra;
  pIdx->nColumn = N;
  pIdx->isResized = 1;
  return SQLITE_OK;
}